

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper_ssl.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
license::CryptoHelperLinux::exportPublicKey
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          CryptoHelperLinux *this)

{
  BIO_METHOD *type;
  BIO *bp;
  rsa_st *rsa;
  long lVar1;
  logic_error *this_00;
  allocator_type local_41;
  string local_40 [32];
  
  if (this->m_pktmp != (EVP_PKEY *)0x0) {
    type = BIO_s_mem();
    bp = BIO_new(type);
    rsa = EVP_PKEY_get1_RSA((EVP_PKEY *)this->m_pktmp);
    i2d_RSAPublicKey_bio(bp,rsa);
    lVar1 = BIO_ctrl(bp,10,0,(void *)0x0);
    local_40[0] = (string)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,(long)(int)lVar1,(value_type_conflict1 *)local_40,&local_41);
    BIO_read(bp,(__return_storage_ptr__->
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start,(int)lVar1);
    BIO_free_all(bp);
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            (local_40,"Export not initialized.Call generateKeyPair first.",(allocator *)&local_41);
  std::logic_error::logic_error(this_00,local_40);
  __cxa_throw(this_00,std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

const vector<unsigned char> CryptoHelperLinux::exportPublicKey() const {
	if (m_pktmp == NULL) {
		throw logic_error(string("Export not initialized.Call generateKeyPair first."));
	}
	BIO *bio_public = BIO_new(BIO_s_mem());
	RSA *rsa = EVP_PKEY_get1_RSA(m_pktmp);
	// PEM_write_bio_RSAPublicKey(bio_public, rsa);
	i2d_RSAPublicKey_bio(bio_public, rsa);
	int keylen = BIO_pending(bio_public);
	vector<unsigned char> buffer(keylen, 0);
	// char *pem_key = (char*) (calloc(keylen + 1, 1));
	BIO_read(bio_public, &buffer[0], keylen);
	BIO_free_all(bio_public);
	return buffer;
}